

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.hpp
# Opt level: O2

Path<SquareCell> * __thiscall
xmotion::Dijkstra::IncSearch<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>
          (Path<SquareCell> *__return_storage_ptr__,Dijkstra *this,
          Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *graph,SquareCell sstate,
          SquareCell gstate,GetNeighbourFunc_t<SquareCell,_double> get_neighbours)

{
  vertex_iterator graph_00;
  vertex_iterator start_vtx;
  GetNeighbourFunc_t<SquareCell,_double> *in_R9;
  vertex_iterator *wp;
  pointer pvVar1;
  _Vector_base<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  local_68;
  _Function_base local_50;
  
  graph_00 = Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::
             ObtainVertexFromVertexMap
                       ((Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)this,
                        sstate);
  start_vtx = Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::
              ObtainVertexFromVertexMap
                        ((Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)this,
                         gstate);
  std::
  function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
  ::function((function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
              *)&local_50,
             (function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
              *)graph);
  PerformSearch<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>
            ((vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
              *)&local_68,this,
             (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)
             graph_00.super_const_vertex_iterator.super_VertexMapTypeIterator.
             super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
             ._M_cur,start_vtx,(vertex_iterator)&local_50,in_R9);
  std::_Function_base::~_Function_base(&local_50);
  (__return_storage_ptr__->super__Vector_base<SquareCell,_std::allocator<SquareCell>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SquareCell,_std::allocator<SquareCell>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SquareCell,_std::allocator<SquareCell>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pvVar1 = local_68._M_impl.super__Vector_impl_data._M_start;
      pvVar1 != local_68._M_impl.super__Vector_impl_data._M_finish; pvVar1 = pvVar1 + 1) {
    std::vector<SquareCell,_std::allocator<SquareCell>_>::push_back
              (__return_storage_ptr__,
               *(value_type **)
                ((long)&(((pvVar1->super_const_vertex_iterator).super_VertexMapTypeIterator.
                          super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
                         ._M_cur)->
                        super__Hash_node_value<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>
                        ._M_storage._M_storage + 8));
  }
  std::
  _Vector_base<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  ::~_Vector_base(&local_68);
  return __return_storage_ptr__;
}

Assistant:

static Path<State> IncSearch(
      Graph<State, Transition, StateIndexer> *graph, State sstate, State gstate,
      GetNeighbourFunc_t<State, Transition> get_neighbours) {
    auto start_vtx = graph->AddVertex(sstate);
    auto goal_vtx = graph->AddVertex(gstate);
    auto path_vtx =
        Dijkstra::PerformSearch(graph, start_vtx, goal_vtx, get_neighbours);

    Path<State> path;
    for (auto &wp : path_vtx) path.push_back(wp->state);
    return path;
  }